

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O0

void __thiscall dg::pta::PointerAnalysisFI::preprocessGEPs(PointerAnalysisFI *this)

{
  bool bVar1;
  PointerGraph *this_00;
  const_iterator this_01;
  reference ppPVar2;
  PointerAnalysis *in_RDI;
  PSNodeGep *gep;
  PSNode *n;
  const_iterator __end4;
  const_iterator __begin4;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range4;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *loop;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  *__range3;
  unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_> *sg;
  const_iterator __end2;
  const_iterator __begin2;
  SubgraphsT *__range2;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  *in_stack_ffffffffffffff88;
  PSNodeGep *in_stack_ffffffffffffff90;
  PSNode *o;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_58;
  reference local_50;
  reference local_48;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *local_40;
  __normal_iterator<const_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
  local_38;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  *local_30;
  reference local_28;
  unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_> *local_20;
  __normal_iterator<const_std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_*,_std::vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>_>
  local_18;
  SubgraphsT *local_10;
  
  this_00 = PointerAnalysis::getPG(in_RDI);
  local_10 = PointerGraph::getSubgraphs(this_00);
  local_18._M_current =
       (unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_> *)
       std::
       vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
       ::begin((vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
                *)in_stack_ffffffffffffff88);
  local_20 = (unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_> *
             )std::
              vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
              ::end((vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
                     *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_*,_std::vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_*,_std::vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    local_28 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_*,_std::vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>_>
               ::operator*(&local_18);
    std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>::
    operator->((unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>
                *)0x1b11bf);
    local_30 = PointerSubgraph::getLoops((PointerSubgraph *)in_stack_ffffffffffffff90);
    local_38._M_current =
         (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
         std::
         vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
         ::begin(in_stack_ffffffffffffff88);
    local_40 = (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               std::
               vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
               ::end(in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<const_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      local_50 = __gnu_cxx::
                 __normal_iterator<const_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
                 ::operator*(&local_38);
      local_48 = local_50;
      local_58._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                      in_stack_ffffffffffffff88);
      this_01 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                          ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                           in_stack_ffffffffffffff88);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                            *)in_stack_ffffffffffffff90,
                           (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                            *)in_stack_ffffffffffffff88);
        if (!bVar1) break;
        ppPVar2 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_58);
        o = *ppPVar2;
        in_stack_ffffffffffffff90 = PSNodeGep::get((PSNode *)in_stack_ffffffffffffff90);
        if (in_stack_ffffffffffffff90 != (PSNodeGep *)0x0) {
          PSNodeGep::setOffset((PSNodeGep *)this_01._M_current,(uint64_t)o);
        }
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_58);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
      ::operator++(&local_38);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_*,_std::vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void preprocessGEPs() {
        // if a node is in a loop (a scc that has more than one node),
        // then every GEP that is also stored to the same memory afterwards
        // in the loop will end up with Offset::UNKNOWN after some
        // number of iterations (in FI analysis), so we can do that right now
        // and save iterations

        assert(getPG() && "Must have PG");
        for (const auto &sg : getPG()->getSubgraphs()) {
            for (const auto &loop : sg->getLoops()) {
                for (PSNode *n : loop) {
                    if (PSNodeGep *gep = PSNodeGep::get(n))
                        gep->setOffset(Offset::UNKNOWN);
                }
            }
        }
    }